

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v8::detail::
       parse_replacement_field<char,fmt::v8::detail::format_string_checker<char,fmt::v8::detail::error_handler,fmt::v8::basic_string_view<char>,char[3]>&>
                 (char *begin,char *end,
                 format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
                 *handler)

{
  int iVar1;
  char local_71;
  undefined1 auStack_60 [7];
  char c;
  id_adapter adapter;
  format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
  *handler_local;
  char *end_local;
  char *begin_local;
  char c_1;
  char *local_10;
  
  end_local = begin + 1;
  adapter._8_8_ = handler;
  if (end_local == end) {
    format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
    ::on_error(handler,"invalid format string");
    return end;
  }
  if (*end_local == '}') {
    iVar1 = format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
            ::on_arg_id(handler);
    format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
    ::on_replacement_field(handler,iVar1,end_local);
  }
  else if (*end_local == '{') {
    format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
    ::on_text(handler,end_local,begin + 2);
  }
  else {
    adapter.handler._0_4_ = 0;
    _auStack_60 = handler;
    if ((*end_local == '}') || (*end_local == ':')) {
      parse_replacement_field<char,_fmt::v8::detail::format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>_&>
      ::id_adapter::operator()((id_adapter *)auStack_60);
      local_10 = end_local;
    }
    else {
      local_10 = do_parse_arg_id<char,fmt::v8::detail::parse_replacement_field<char,fmt::v8::detail::format_string_checker<char,fmt::v8::detail::error_handler,fmt::v8::basic_string_view<char>,char[3]>&>(char_const*,char_const*,fmt::v8::detail::format_string_checker<char,fmt::v8::detail::error_handler,fmt::v8::basic_string_view<char>,char[3]>&)::id_adapter&>
                           (end_local,end,(id_adapter *)auStack_60);
    }
    end_local = local_10;
    if (local_10 == end) {
      local_71 = '\0';
    }
    else {
      local_71 = *local_10;
    }
    if (local_71 == '}') {
      format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
      ::on_replacement_field
                ((format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
                  *)adapter._8_8_,(int)adapter.handler,local_10);
    }
    else {
      if (local_71 != ':') {
        format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
        ::on_error((format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
                    *)adapter._8_8_,"missing \'}\' in format string");
        return end;
      }
      end_local = format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
                  ::on_format_specs((format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
                                     *)adapter._8_8_,(int)adapter.handler,local_10 + 1,end);
      if ((end_local == end) || (*end_local != '}')) {
        format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
        ::on_error((format_string_checker<char,_fmt::v8::detail::error_handler,_fmt::v8::basic_string_view<char>,_char[3]>
                    *)adapter._8_8_,"unknown format specifier");
        return end;
      }
    }
  }
  return end_local + 1;
}

Assistant:

FMT_CONSTEXPR auto parse_replacement_field(const Char* begin, const Char* end,
                                           Handler&& handler) -> const Char* {
  struct id_adapter {
    Handler& handler;
    int arg_id;

    FMT_CONSTEXPR void operator()() { arg_id = handler.on_arg_id(); }
    FMT_CONSTEXPR void operator()(int id) { arg_id = handler.on_arg_id(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      arg_id = handler.on_arg_id(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}